

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O0

int ExtractMetadataFromJPEG(j_decompress_ptr dinfo,Metadata *metadata)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  size_t marker_data_length;
  char *marker_data;
  MetadataPayload *payload;
  int i;
  jpeg_saved_marker_ptr_conflict marker;
  MetadataPayload *in_stack_000017e0;
  j_decompress_ptr in_stack_000017e8;
  MetadataPayload *in_stack_ffffffffffffffb8;
  int local_24;
  undefined8 *local_20;
  int local_4;
  
  iVar1 = StoreICCP(in_stack_000017e8,in_stack_000017e0);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    for (local_20 = *(undefined8 **)(in_RDI + 400); local_20 != (undefined8 *)0x0;
        local_20 = (undefined8 *)*local_20) {
      local_24 = 0;
      while (ExtractMetadataFromJPEG::kJPEGMetadataMap[local_24].marker != 0) {
        if ((((uint)*(byte *)(local_20 + 1) ==
              ExtractMetadataFromJPEG::kJPEGMetadataMap[local_24].marker) &&
            (ExtractMetadataFromJPEG::kJPEGMetadataMap[local_24].signature_length <
             (ulong)*(uint *)(local_20 + 2))) &&
           (iVar1 = memcmp((void *)local_20[3],
                           ExtractMetadataFromJPEG::kJPEGMetadataMap[local_24].signature,
                           ExtractMetadataFromJPEG::kJPEGMetadataMap[local_24].signature_length),
           iVar1 == 0)) {
          if (*(long *)(in_RSI + ExtractMetadataFromJPEG::kJPEGMetadataMap[local_24].storage_offset)
              == 0) {
            iVar1 = MetadataCopy((char *)(local_20[3] +
                                         ExtractMetadataFromJPEG::kJPEGMetadataMap[local_24].
                                         signature_length),
                                 (ulong)*(uint *)(local_20 + 2) -
                                 ExtractMetadataFromJPEG::kJPEGMetadataMap[local_24].
                                 signature_length,in_stack_ffffffffffffffb8);
            if (iVar1 == 0) {
              return 0;
            }
          }
          else {
            fprintf(stderr,"Ignoring additional \'%s\' marker\n",
                    ExtractMetadataFromJPEG::kJPEGMetadataMap[local_24].signature);
          }
        }
        local_24 = local_24 + 1;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ExtractMetadataFromJPEG(j_decompress_ptr dinfo,
                                   Metadata* const metadata) {
  static const struct {
    int marker;
    const char* signature;
    size_t signature_length;
    size_t storage_offset;
  } kJPEGMetadataMap[] = {
    // Exif 2.2 Section 4.7.2 Interoperability Structure of APP1 ...
    { JPEG_APP1, "Exif\0",                        6, METADATA_OFFSET(exif) },
    // XMP Specification Part 3 Section 3 Embedding XMP Metadata ... #JPEG
    // TODO(jzern) Add support for 'ExtendedXMP'
    { JPEG_APP1, "http://ns.adobe.com/xap/1.0/", 29, METADATA_OFFSET(xmp) },
    { 0, NULL, 0, 0 },
  };
  jpeg_saved_marker_ptr marker;
  // Treat ICC profiles separately as they may be segmented and out of order.
  if (!StoreICCP(dinfo, &metadata->iccp)) return 0;

  for (marker = dinfo->marker_list; marker != NULL; marker = marker->next) {
    int i;
    for (i = 0; kJPEGMetadataMap[i].marker != 0; ++i) {
      if (marker->marker == kJPEGMetadataMap[i].marker &&
          marker->data_length > kJPEGMetadataMap[i].signature_length &&
          !memcmp(marker->data, kJPEGMetadataMap[i].signature,
                  kJPEGMetadataMap[i].signature_length)) {
        MetadataPayload* const payload =
            (MetadataPayload*)((uint8_t*)metadata +
                               kJPEGMetadataMap[i].storage_offset);

        if (payload->bytes == NULL) {
          const char* marker_data = (const char*)marker->data +
                                    kJPEGMetadataMap[i].signature_length;
          const size_t marker_data_length =
              marker->data_length - kJPEGMetadataMap[i].signature_length;
          if (!MetadataCopy(marker_data, marker_data_length, payload)) return 0;
        } else {
          fprintf(stderr, "Ignoring additional '%s' marker\n",
                  kJPEGMetadataMap[i].signature);
        }
      }
    }
  }
  return 1;
}